

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

NodeInputData *
dxil_spv::Converter::get_node_input
          (NodeInputData *__return_storage_ptr__,LLVMBCParser *parser,char *entry)

{
  Module *module;
  MDNode *meta;
  
  module = LLVMBCParser::get_module(parser);
  meta = get_entry_point_meta(module,entry);
  if (meta == (MDNode *)0x0) {
    (__return_storage_ptr__->node_id)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->node_id).field_2;
    (__return_storage_ptr__->node_id)._M_string_length = 0;
    (__return_storage_ptr__->node_id).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->payload_stride = 0;
    __return_storage_ptr__->launch_type = Invalid;
    __return_storage_ptr__->node_array_index = 0;
    (__return_storage_ptr__->grid_buffer).offset = 0;
    (__return_storage_ptr__->grid_buffer).component_type = Invalid;
    *(undefined8 *)&(__return_storage_ptr__->grid_buffer).count = 0;
    __return_storage_ptr__->broadcast_grid[1] = 0;
    __return_storage_ptr__->broadcast_grid[2] = 0;
    __return_storage_ptr__->thread_group_size_spec_id[0] = 0;
    __return_storage_ptr__->thread_group_size_spec_id[1] = 0;
    *(undefined8 *)(__return_storage_ptr__->thread_group_size_spec_id + 2) = 0;
    __return_storage_ptr__->max_broadcast_grid_spec_id[1] = 0;
    __return_storage_ptr__->max_broadcast_grid_spec_id[2] = 0;
    __return_storage_ptr__->recursion_factor = 0;
    __return_storage_ptr__->coalesce_factor = 0;
    (__return_storage_ptr__->node_share_input_id)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->node_share_input_id).field_2;
    (__return_storage_ptr__->node_share_input_id)._M_string_length = 0;
    (__return_storage_ptr__->node_share_input_id).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->node_share_input_array_index = 0;
    __return_storage_ptr__->local_root_arguments_table_index = 0;
    __return_storage_ptr__->is_indirect_bda_stride_program_entry_spec_id = 0;
    __return_storage_ptr__->is_entry_point_spec_id = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->is_indirect_bda_stride_program_entry_spec_id + 3)
         = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->dispatch_grid_is_upper_bound_spec_id + 3) = 0;
  }
  else {
    Impl::get_node_input(__return_storage_ptr__,meta);
  }
  return __return_storage_ptr__;
}

Assistant:

NodeInputData Converter::get_node_input(const LLVMBCParser &parser, const char *entry)
{
	auto *entry_point_meta = get_entry_point_meta(parser.get_module(), entry);
	if (!entry_point_meta)
		return {};
	return Impl::get_node_input(entry_point_meta);
}